

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void __thiscall PSBTOutput::Serialize<DataStream>(PSBTOutput *this,DataStream *s)

{
  uint uVar1;
  pointer ptVar2;
  KeyOriginInfo hd_keypath;
  bool bVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  pointer v;
  long in_FS_OFFSET;
  undefined8 uStack_98;
  VectorWriter s_value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  KeyOriginInfo local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->redeem_script).super_CScriptBase._size;
  uVar5 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar5 = uVar1;
  }
  if (uVar5 != 0) {
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&value);
    Serialize<DataStream,28u,unsigned_char>
              (s,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)this);
  }
  uVar1 = (this->witness_script).super_CScriptBase._size;
  uVar5 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar5 = uVar1;
  }
  if (uVar5 != 0) {
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&value);
    Serialize<DataStream,28u,unsigned_char>(s,&(this->witness_script).super_CScriptBase);
  }
  SerializeHDKeypaths<DataStream>(s,&this->hd_keypaths,(CompactSizeWriter)0x2);
  for (p_Var4 = (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 2));
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4[2]._M_right);
  }
  bVar3 = base_blob<256U>::IsNull((base_blob<256U> *)&this->m_tap_internal_key);
  if (!bVar3) {
    SerializeToVector<DataStream,unsigned_char>
              (s,
               "\x05\x06\aZN6walletL14bumpfee_helperENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3$_0"
              );
    ToByteVector<XOnlyPubKey>(&value,&this->m_tap_internal_key);
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if ((this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_tap_tree).
      super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SerializeToVector<DataStream,unsigned_char>
              (s,
               "\x06\aZN6walletL14bumpfee_helperENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3$_0"
              );
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    VectorWriter::VectorWriter(&s_value,&value,0);
    ptVar2 = (this->m_tap_tree).
             super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (v = (this->m_tap_tree).
             super__Vector_base<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; v != ptVar2; v = v + 1) {
      VectorWriter::operator<<
                (&s_value,&(v->
                           super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ).
                           super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           .field_0x19);
      VectorWriter::operator<<
                (&s_value,&(v->
                           super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ).
                           super__Tuple_impl<1UL,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           .super__Head_base<1UL,_unsigned_char,_false>._M_head_impl);
      Serialize<VectorWriter,unsigned_char,std::allocator<unsigned_char>>
                (&s_value,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)v);
    }
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&value);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  for (p_Var4 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    SerializeToVector<DataStream,unsigned_char,XOnlyPubKey>
              (s,
               "\aZN6walletL14bumpfee_helperENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE3$_0"
               ,(XOnlyPubKey *)(p_Var4 + 1));
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    VectorWriter::VectorWriter
              (&s_value,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,0);
    Serialize<VectorWriter,uint256,std::less<uint256>,std::allocator<uint256>>
              (&s_value,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)(p_Var4 + 2));
    KeyOriginInfo::KeyOriginInfo(&local_58,(KeyOriginInfo *)&p_Var4[3]._M_left);
    hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    hd_keypath._0_8_ = uStack_98;
    hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)s_value.vchData;
    hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)s_value.nPos;
    SerializeKeyOrigin<VectorWriter>(&s_value,hd_keypath);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&local_58.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  for (p_Var4 = (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->unknown)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var4 + 1));
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var4[1]._M_right);
  }
  DataStream::operator<<(s,"");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Serialize(Stream& s) const {
        // Write the redeem script
        if (!redeem_script.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_OUT_REDEEMSCRIPT));
            s << redeem_script;
        }

        // Write the witness script
        if (!witness_script.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_OUT_WITNESSSCRIPT));
            s << witness_script;
        }

        // Write any hd keypaths
        SerializeHDKeypaths(s, hd_keypaths, CompactSizeWriter(PSBT_OUT_BIP32_DERIVATION));

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write taproot internal key
        if (!m_tap_internal_key.IsNull()) {
            SerializeToVector(s, PSBT_OUT_TAP_INTERNAL_KEY);
            s << ToByteVector(m_tap_internal_key);
        }

        // Write taproot tree
        if (!m_tap_tree.empty()) {
            SerializeToVector(s, PSBT_OUT_TAP_TREE);
            std::vector<unsigned char> value;
            VectorWriter s_value{value, 0};
            for (const auto& [depth, leaf_ver, script] : m_tap_tree) {
                s_value << depth;
                s_value << leaf_ver;
                s_value << script;
            }
            s << value;
        }

        // Write taproot bip32 keypaths
        for (const auto& [xonly, leaf] : m_tap_bip32_paths) {
            const auto& [leaf_hashes, origin] = leaf;
            SerializeToVector(s, PSBT_OUT_TAP_BIP32_DERIVATION, xonly);
            std::vector<unsigned char> value;
            VectorWriter s_value{value, 0};
            s_value << leaf_hashes;
            SerializeKeyOrigin(s_value, origin);
            s << value;
        }

        // Write unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        s << PSBT_SEPARATOR;
    }